

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O1

bool hashSearch<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *keys,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *vals,string *hash_str,string *map_name,string *default_value,
               uint8_t expansion,uint8_t reduction,bool nonKeyLookups)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  _Alloc_hider _Var8;
  pointer piVar9;
  uint uVar10;
  bool bVar11;
  uint32_t uVar12;
  int iVar13;
  size_t n;
  long lVar14;
  long *plVar15;
  size_t sVar16;
  long *plVar17;
  byte bVar18;
  _Bit_type *p_Var19;
  uint uVar20;
  string *psVar21;
  _Bit_type *p_Var22;
  pointer pbVar23;
  uint uVar24;
  ulong uVar25;
  size_type sVar26;
  size_type sVar27;
  long lVar28;
  uint8_t active_coeffs;
  byte bVar29;
  uint uVar30;
  string upper_name;
  vector<bool,_std::allocator<bool>_> hash_table;
  vector<int,_std::allocator<int>_> mapping;
  array<unsigned_int,_6UL> best_c;
  uint local_210;
  string local_1f0;
  string *local_1d0;
  string *local_1c8;
  _Bit_type *local_1c0;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  uint local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  uint local_184;
  vector<bool,_std::allocator<bool>_> local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  vector<int,_std::allocator<int>_> local_128;
  size_type local_110;
  string *local_108;
  long local_100;
  pointer local_f8;
  pointer local_f0;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  lVar28 = (long)(keys->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(keys->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  uVar25 = lVar28 >> 5;
  local_1d0 = hash_str;
  local_1c8 = map_name;
  local_158 = vals;
  local_108 = default_value;
  if (uVar25 < 2) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x84,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  bVar11 = hasDuplicates<std::__cxx11::string>(keys);
  if (bVar11) {
    __assert_fail("!hasDuplicates(keys)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x85,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  if ((long)(local_158->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(local_158->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != lVar28) {
    __assert_fail("vals.size() == keys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch.h"
                  ,0x86,
                  "bool hashSearch(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = std::basic_string<char>]"
                 );
  }
  p_Var19 = (_Bit_type *)0x0;
  n = getModulusBitmask((uVar25 * expansion) / (ulong)reduction);
  local_110 = n + 1;
  local_1f0._M_dataplus._M_p = local_1f0._M_dataplus._M_p & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_180,local_110,(bool *)&local_1f0,(allocator_type *)&local_148);
  uVar5 = c_max._M_elems[2];
  uVar30 = c_max._M_elems[1];
  c._M_elems[0] = c_min._M_elems[0];
  local_1b0 = c_max._M_elems[0];
  local_210 = (uint)n;
  local_150 = keys;
  if (c_min._M_elems[0] <= c_max._M_elems[0]) {
    local_1b4 = c_min._M_elems[1];
    local_1a8 = c_min._M_elems[2];
    bVar18 = 7;
    uVar20 = c_min._M_elems[0];
    do {
      uVar6 = c_max._M_elems[3];
      c._M_elems[1] = local_1b4;
      local_1ac = uVar20;
      if (local_1b4 <= uVar30) {
        local_1a0 = c_min._M_elems[3];
        uVar20 = local_1b4;
        do {
          uVar7 = c_max._M_elems[4];
          c._M_elems[2] = local_1a8;
          local_1a4 = uVar20;
          if (local_1a8 <= uVar5) {
            local_198 = c_min._M_elems[4];
            uVar20 = local_1a8;
            do {
              c._M_elems[3] = local_1a0;
              local_19c = uVar20;
              if (local_1a0 <= uVar6) {
                local_190 = c_min._M_elems[5];
                local_188 = c_max._M_elems[5];
                uVar24 = local_1a0;
                uVar20 = c_max._M_elems[5];
                do {
                  c._M_elems[4] = local_198;
                  local_194 = uVar24;
                  uVar10 = local_198;
                  uVar24 = local_190;
                  uVar4 = local_18c;
                  p_Var22 = local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  while (local_18c = uVar10, local_190 = uVar24,
                        local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = p_Var22,
                        local_18c <= uVar7) {
                    c._M_elems[5] = uVar24;
                    if (uVar24 <= uVar20) {
                      pbVar23 = (keys->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      local_f8 = (keys->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                      lVar28 = (long)local_f8 - (long)pbVar23;
                      local_100 = lVar28 >> 5;
                      local_1c0 = p_Var22;
                      local_f0 = pbVar23;
                      do {
                        lVar14 = 5;
                        bVar29 = 0;
                        do {
                          bVar29 = (bVar29 + 1) - (c._M_elems[lVar14] == 0);
                          bVar11 = lVar14 != 0;
                          lVar14 = lVar14 + -1;
                        } while (bVar11);
                        if (bVar29 < bVar18) {
                          sVar16 = n;
                          if (n != 0xffffffffffffffff) {
                            do {
                              uVar25 = sVar16 + 0x3f;
                              if (-1 < (long)sVar16) {
                                uVar25 = sVar16;
                              }
                              bVar3 = (byte)sVar16 & 0x3f;
                              p_Var22[((long)uVar25 >> 6) +
                                      ((ulong)((sVar16 & 0x800000000000003f) < 0x8000000000000001) -
                                      1)] = p_Var22[((long)uVar25 >> 6) +
                                                    ((ulong)((sVar16 & 0x800000000000003f) <
                                                            0x8000000000000001) - 1)] &
                                            (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
                              bVar11 = sVar16 != 0;
                              sVar16 = sVar16 - 1;
                            } while (bVar11);
                          }
                          local_184 = uVar24;
                          bVar11 = lVar28 != 0;
                          if (local_f8 != pbVar23) {
                            bVar11 = true;
                            lVar14 = local_100;
                            do {
                              lVar14 = lVar14 + -1;
                              sVar27 = pbVar23[lVar14]._M_string_length;
                              if (sVar27 == 0) {
                                uVar20 = 0;
                              }
                              else {
                                p_Var19 = (_Bit_type *)pbVar23[lVar14]._M_dataplus._M_p;
                                sVar26 = 0;
                                uVar20 = 0;
                                do {
                                  uVar12 = hash((int)*(char *)((long)p_Var19 + sVar26));
                                  uVar20 = uVar20 ^ uVar12;
                                  sVar26 = sVar26 + 1;
                                } while (sVar27 != sVar26);
                              }
                              uVar20 = uVar20 & local_210;
                              p_Var22 = local_1c0;
                              pbVar23 = local_f0;
                              if ((local_1c0[uVar20 >> 6] >> ((ulong)uVar20 & 0x3f) & 1) != 0)
                              break;
                              local_1c0[uVar20 >> 6] =
                                   1L << ((byte)uVar20 & 0x3f) | local_1c0[uVar20 >> 6];
                              bVar11 = lVar14 != 0;
                            } while (bVar11);
                          }
                          uVar24 = local_184;
                          uVar20 = local_188;
                          if (!bVar11) {
                            local_58[0] = c._M_elems[4];
                            local_58[1] = c._M_elems[5];
                            local_68[0] = c._M_elems[0];
                            local_68[1] = c._M_elems[1];
                            auStack_60[0] = c._M_elems[2];
                            auStack_60[1] = c._M_elems[3];
                            bVar18 = bVar29;
                          }
                        }
                        uVar24 = uVar24 + 1;
                        c._M_elems[5] = uVar24;
                      } while (uVar24 <= uVar20);
                    }
                    c._M_elems[4] = local_18c + 1;
                    keys = local_150;
                    uVar10 = local_18c + 1;
                    uVar24 = local_190;
                    uVar4 = local_18c;
                    p_Var22 = local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  }
                  uVar24 = local_194 + 1;
                  c._M_elems[3] = uVar24;
                  local_18c = uVar4;
                } while (uVar24 <= uVar6);
              }
              uVar20 = local_19c + 1;
              c._M_elems[2] = uVar20;
            } while (uVar20 <= uVar5);
          }
          uVar20 = local_1a4 + 1;
          c._M_elems[1] = uVar20;
        } while (uVar20 <= uVar30);
      }
      uVar20 = local_1ac + 1;
      c._M_elems[0] = uVar20;
    } while (uVar20 <= local_1b0);
    p_Var19 = (_Bit_type *)CONCAT71((int7)((ulong)p_Var19 >> 8),bVar18 != 7);
  }
  if ((char)p_Var19 != '\0') {
    c._M_elems[4] = local_58[0];
    c._M_elems[5] = local_58[1];
    c._M_elems[0] = local_68[0];
    c._M_elems[1] = local_68[1];
    c._M_elems[2] = auStack_60[0];
    c._M_elems[3] = auStack_60[1];
    local_1f0._M_dataplus._M_p._0_4_ = 0xffffffff;
    local_1c0 = p_Var19;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_128,local_110,(value_type_conflict4 *)&local_1f0,(allocator_type *)&local_148)
    ;
    piVar9 = local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    pbVar23 = (keys->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar28 = (long)(keys->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar23;
    if (lVar28 != 0) {
      lVar28 = lVar28 >> 5;
      do {
        lVar28 = lVar28 + -1;
        sVar27 = pbVar23[lVar28]._M_string_length;
        if (sVar27 == 0) {
          uVar30 = 0;
        }
        else {
          pcVar2 = pbVar23[lVar28]._M_dataplus._M_p;
          sVar26 = 0;
          uVar30 = 0;
          do {
            uVar12 = hash((int)pcVar2[sVar26]);
            uVar30 = uVar30 ^ uVar12;
            sVar26 = sVar26 + 1;
            keys = local_150;
          } while (sVar27 != sVar26);
        }
        piVar9[uVar30 & local_210] = (int)lVar28;
      } while (lVar28 != 0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,local_158);
    pcVar2 = (local_1c8->_M_dataplus)._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar2,pcVar2 + local_1c8->_M_string_length);
    getCommonCodeGen<std::__cxx11::string>
              (&local_1f0,keys,&local_48,&local_128,n,&local_c8,nonKeyLookups);
    std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_1f0);
    paVar1 = &local_1f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    psVar21 = (string *)(local_1c8->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,psVar21,
               (pointer)((long)&(psVar21->_M_dataplus)._M_p + local_1c8->_M_string_length));
    local_88.field_2._M_allocated_capacity._0_7_ = 0x74733a3a647473;
    local_88.field_2._7_4_ = 0x676e6972;
    local_88._M_string_length = 0xb;
    local_88.field_2._M_local_buf[0xb] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    hashStr(&local_1f0,psVar21,n,local_108,&local_e8,&local_88,nonKeyLookups);
    std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_1f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT17(local_88.field_2._M_local_buf[7],
                               local_88.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (local_1c8->_M_dataplus)._M_p;
    local_1f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar2,pcVar2 + local_1c8->_M_string_length);
    _Var8._M_p = local_1f0._M_dataplus._M_p;
    if (local_1f0._M_string_length != 0) {
      sVar27 = 0;
      do {
        iVar13 = toupper((int)_Var8._M_p[sVar27]);
        _Var8._M_p[sVar27] = (char)iVar13;
        sVar27 = sVar27 + 1;
      } while (local_1f0._M_string_length != sVar27);
    }
    std::operator+(&local_a8,"#endif // POIFECT_",&local_1f0);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_a8);
    plVar17 = plVar15 + 2;
    if ((long *)*plVar15 == plVar17) {
      local_138 = *plVar17;
      lStack_130 = plVar15[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *plVar17;
      local_148 = (long *)*plVar15;
    }
    local_140 = plVar15[1];
    *plVar15 = (long)plVar17;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_1d0,(ulong)local_148);
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    p_Var19 = local_1c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return (bool)(char)p_Var19;
}

Assistant:

bool hashSearch(const std::vector<KeyType>& keys,
                const std::vector<std::string>& vals,
                std::string& hash_str,
                std::string map_name = "PoifectMap",
                std::string default_value = "",
                uint8_t expansion = 1,
                uint8_t reduction = 1,
                bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    size_t n = getModulusBitmask(keys.size() * expansion / reduction);
    std::vector<bool> hash_table(n+1, false);
    uint8_t best_num_c = c.size()+1;
    std::array<uint32_t, c.size()> best_c;

    #define ITERATE_INDEX(i) for(c[i] = c_min[i]; c[i] <= c_max[i]; c[i]++)

    ITERATE_INDEX(0)
    ITERATE_INDEX(1)
    ITERATE_INDEX(2)
    ITERATE_INDEX(3)
    ITERATE_INDEX(4)
    ITERATE_INDEX(5)
    {
        const uint8_t num_c = checkNonzeroCoeffs();
        if(num_c < best_num_c && !hasCollisions(keys, n, hash_table)){
            best_num_c = num_c;
            best_c = c;
        }
    }

    if(best_num_c == c.size()+1) return false;

    c = best_c;
    std::vector<int> mapping(n+1, -1);
    for(size_t i = keys.size()-1; i < std::numeric_limits<size_t>::max(); i--)
        mapping[hash(keys[i])&n] = i;

    hash_str = getCommonCodeGen(keys, vals, mapping, n, map_name, nonKeyLookups);

    hash_str += hashStr(keys[0], n, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";

    return true;
}